

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O0

int Aig_ManPackAddPatternTry(Aig_ManPack_t *p,int iBit,Vec_Int_t *vLits)

{
  Vec_Wrd_t *pVVar1;
  int iVar2;
  int iVar3;
  word *pwVar4;
  word *pwVar5;
  int local_3c;
  int Lit;
  int i;
  word *pPres;
  word *pInfo;
  Vec_Int_t *vLits_local;
  int iBit_local;
  Aig_ManPack_t *p_local;
  
  local_3c = 0;
  do {
    iVar2 = Vec_IntSize(vLits);
    if (iVar2 <= local_3c) {
      for (local_3c = 0; iVar2 = Vec_IntSize(vLits), local_3c < iVar2; local_3c = local_3c + 1) {
        iVar2 = Vec_IntEntry(vLits,local_3c);
        pVVar1 = p->vPiPats;
        iVar3 = Abc_Lit2Var(iVar2);
        pwVar4 = Vec_WrdEntryP(pVVar1,iVar3);
        pVVar1 = p->vPiCare;
        iVar3 = Abc_Lit2Var(iVar2);
        pwVar5 = Vec_WrdEntryP(pVVar1,iVar3);
        Abc_InfoSetBit((uint *)pwVar5,iBit);
        iVar3 = Abc_InfoHasBit((uint *)pwVar4,iBit);
        iVar2 = Abc_LitIsCompl(iVar2);
        if (iVar3 == iVar2) {
          Abc_InfoXorBit((uint *)pwVar4,iBit);
        }
      }
      return 1;
    }
    iVar2 = Vec_IntEntry(vLits,local_3c);
    pVVar1 = p->vPiPats;
    iVar3 = Abc_Lit2Var(iVar2);
    pwVar4 = Vec_WrdEntryP(pVVar1,iVar3);
    pVVar1 = p->vPiCare;
    iVar3 = Abc_Lit2Var(iVar2);
    pwVar5 = Vec_WrdEntryP(pVVar1,iVar3);
    iVar3 = Abc_InfoHasBit((uint *)pwVar5,iBit);
    if (iVar3 != 0) {
      iVar3 = Abc_InfoHasBit((uint *)pwVar4,iBit);
      iVar2 = Abc_LitIsCompl(iVar2);
      if (iVar3 == iVar2) {
        return 0;
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

int Aig_ManPackAddPatternTry( Aig_ManPack_t * p, int iBit, Vec_Int_t * vLits )
{
    word * pInfo, * pPres;
    int i, Lit;
    Vec_IntForEachEntry( vLits, Lit, i )
    {
        pInfo = Vec_WrdEntryP( p->vPiPats, Abc_Lit2Var(Lit) );
        pPres = Vec_WrdEntryP( p->vPiCare, Abc_Lit2Var(Lit) );
        if ( Abc_InfoHasBit( (unsigned *)pPres, iBit ) && 
             Abc_InfoHasBit( (unsigned *)pInfo, iBit ) == Abc_LitIsCompl(Lit) )
             return 0;
    }
    Vec_IntForEachEntry( vLits, Lit, i )
    {
        pInfo = Vec_WrdEntryP( p->vPiPats, Abc_Lit2Var(Lit) );
        pPres = Vec_WrdEntryP( p->vPiCare, Abc_Lit2Var(Lit) );
        Abc_InfoSetBit( (unsigned *)pPres, iBit );
        if ( Abc_InfoHasBit( (unsigned *)pInfo, iBit ) == Abc_LitIsCompl(Lit) )
             Abc_InfoXorBit( (unsigned *)pInfo, iBit );
    }
    return 1;
}